

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::CreateGraphicThread::runThread
          (TestStatus *__return_storage_ptr__,CreateGraphicThread *this)

{
  size_type *psVar1;
  pointer pVVar2;
  pointer pVVar3;
  qpTestResult qVar4;
  DeviceInterface *vk;
  ulong uVar5;
  int iVar6;
  TestStatus result;
  Move<vk::Handle<(vk::HandleType)18>_> local_a0;
  ResultCollector resultCollector;
  
  tcu::ResultCollector::ResultCollector(&resultCollector);
  iVar6 = 0;
  do {
    pVVar2 = (this->m_pipelineInfo->
             super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar3 = (this->m_pipelineInfo->
             super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    vk = Context::getDeviceInterface((this->super_ThreadGroupThread).m_context);
    uVar5 = (long)iVar6 % (long)((int)((ulong)((long)pVVar3 - (long)pVVar2) >> 4) * 0x38e38e39) &
            0xffffffff;
    ::vk::createGraphicsPipeline
              (&local_a0,vk,
               (((this->super_ThreadGroupThread).m_queues)->m_logicalDevice).
               super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkPipelineCache)(this->super_ThreadGroupThread).m_pipelineCache.m_internal,
               (this->m_pipelineInfo->
               super__Vector_base<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar5,(VkAllocationCallbacks *)0x0);
    executeGraphicPipeline
              (&result,(this->super_ThreadGroupThread).m_context,(VkPipeline *)&local_a0,
               (this->super_ThreadGroupThread).m_pipelineLayout,
               (this->super_ThreadGroupThread).m_descriptorSetLayout,
               (this->super_ThreadGroupThread).m_queues,this->m_renderPass,
               (((this->super_ThreadGroupThread).m_shadersExecutions)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5]);
    tcu::ResultCollector::addResult(&resultCollector,result.m_code,&result.m_description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result.m_description._M_dataplus._M_p != &result.m_description.field_2) {
      operator_delete(result.m_description._M_dataplus._M_p,
                      result.m_description.field_2._M_allocated_capacity + 1);
    }
    if (local_a0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_a0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_a0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 100);
  qVar4 = tcu::ResultCollector::getResult(&resultCollector);
  psVar1 = &result.m_description._M_string_length;
  result._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&result,resultCollector.m_message._M_dataplus._M_p,
             resultCollector.m_message._M_dataplus._M_p + resultCollector.m_message._M_string_length
            );
  __return_storage_ptr__->m_code = qVar4;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,result._0_8_,
             result.m_description._M_dataplus._M_p + result._0_8_);
  if ((size_type *)result._0_8_ != psVar1) {
    operator_delete((void *)result._0_8_,result.m_description._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resultCollector.m_message._M_dataplus._M_p != &resultCollector.m_message.field_2) {
    operator_delete(resultCollector.m_message._M_dataplus._M_p,
                    resultCollector.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resultCollector.m_prefix._M_dataplus._M_p != &resultCollector.m_prefix.field_2) {
    operator_delete(resultCollector.m_prefix._M_dataplus._M_p,
                    resultCollector.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TestStatus	runThread		(void)
	{
		ResultCollector		resultCollector;
		for (int executionNdx = 0; executionNdx < EXECUTION_PER_THREAD; ++executionNdx)
		{
			const int shaderNdx					= executionNdx % (int)m_pipelineInfo.size();
			const DeviceInterface&	vk			= m_context.getDeviceInterface();
			const VkDevice			device		= m_queues.getDevice();
			Move<VkPipeline>		pipeline	= createGraphicsPipeline(vk,device, m_pipelineCache, &m_pipelineInfo[shaderNdx]);

			TestStatus result = executeGraphicPipeline(m_context, *pipeline, m_pipelineLayout, m_descriptorSetLayout, m_queues, m_renderPass, m_shadersExecutions[shaderNdx]);
			resultCollector.addResult(result.getCode(), result.getDescription());
		}
		return TestStatus(resultCollector.getResult(), resultCollector.getMessage());
	}